

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

bool __thiscall flatbuffers::cpp::CppGenerator::generate_bfbs_embed(CppGenerator *this)

{
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  StructDef *name;
  string *psVar4;
  Namespace *name_space;
  string *psVar5;
  pointer pcVar6;
  bool bVar7;
  char *__s;
  long *plVar8;
  mapped_type *pmVar9;
  uint8_t *buffer;
  size_type *psVar10;
  _Alloc_hider _Var11;
  string final_code;
  string file_path;
  string binary_schema_hex_text;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  key_type local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this_00 = &this->code_;
  CodeWriter::Clear(this_00);
  __s = BaseGenerator::FlatBuffersGeneratedWarning();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,__s,(allocator<char> *)&local_3d0);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_450,0,(char *)0x0,0x36de3f);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_430.field_2._M_allocated_capacity = *psVar10;
    local_430.field_2._8_8_ = plVar8[3];
  }
  else {
    local_430.field_2._M_allocated_capacity = *psVar10;
    local_430._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_430._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_430);
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_370.field_2._M_allocated_capacity = *psVar10;
    local_370.field_2._8_8_ = plVar8[3];
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  }
  else {
    local_370.field_2._M_allocated_capacity = *psVar10;
    local_370._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_370._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  name = ((this->super_BaseGenerator).parser_)->root_struct_def_;
  if (name == (StructDef *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"// Binary schema not generated, no root struct found","");
    CodeWriter::operator+=(this_00,&local_50);
    _Var11._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0017bdb4;
  }
  else {
    psVar4 = (this->super_BaseGenerator).file_name_;
    name_space = (name->super_Definition).defined_namespace;
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"bfbs","");
    GenIncludeGuard(&local_430,psVar4,name_space,&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_70,"#ifndef ",&local_430);
    CodeWriter::operator+=(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_90,"#define ",&local_430);
    CodeWriter::operator+=(this_00,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    CodeWriter::operator+=(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((((this->super_BaseGenerator).parser_)->opts).gen_nullable == true) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"#pragma clang system_header\n\n","");
      CodeWriter::operator+=(this_00,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"#include <cstddef>","");
    CodeWriter::operator+=(this_00,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"#include <cstdint>","");
    CodeWriter::operator+=(this_00,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    SetNameSpace(this,(name->super_Definition).defined_namespace);
    EscapeKeyword(&local_450,this,(string *)name);
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"STRUCT_NAME","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_3d0);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    buffer = FlatBufferBuilderImpl<false>::GetBufferPointer
                       (&((this->super_BaseGenerator).parser_)->builder_);
    uVar3 = (((this->super_BaseGenerator).parser_)->builder_).buf_.size_;
    paVar1 = &local_410.field_2;
    local_410._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"      ","");
    paVar2 = &local_3f0.field_2;
    local_3f0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"");
    BufferToHexText(&local_3d0,buffer,(ulong)uVar3,0x69,&local_410,&local_3f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"struct {{STRUCT_NAME}}BinarySchema {","");
    CodeWriter::operator+=(this_00,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"  static const uint8_t *data() {","");
    CodeWriter::operator+=(this_00,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"    // Buffer containing the binary schema.","");
    CodeWriter::operator+=(this_00,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    NumToString<unsigned_int>
              (&local_3f0,(((this->super_BaseGenerator).parser_)->builder_).buf_.size_);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x36c4f2);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_410.field_2._M_allocated_capacity = *psVar10;
      local_410.field_2._8_8_ = plVar8[3];
      local_410._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_410.field_2._M_allocated_capacity = *psVar10;
      local_410._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_410._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_410);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_390.field_2._M_allocated_capacity = *psVar10;
      local_390.field_2._8_8_ = plVar8[3];
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    }
    else {
      local_390.field_2._M_allocated_capacity = *psVar10;
      local_390._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_390._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,local_3d0._M_dataplus._M_p,
               local_3d0._M_dataplus._M_p + local_3d0._M_string_length);
    CodeWriter::operator+=(this_00,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"    };","");
    CodeWriter::operator+=(this_00,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"    return bfbsData;","");
    CodeWriter::operator+=(this_00,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"  }","");
    CodeWriter::operator+=(this_00,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"  static size_t size() {","");
    CodeWriter::operator+=(this_00,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    NumToString<unsigned_int>
              (&local_3f0,(((this->super_BaseGenerator).parser_)->builder_).buf_.size_);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x37b311);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_410.field_2._M_allocated_capacity = *psVar10;
      local_410.field_2._8_8_ = plVar8[3];
      local_410._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_410.field_2._M_allocated_capacity = *psVar10;
      local_410._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_410._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_410);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_3b0.field_2._M_allocated_capacity = *psVar10;
      local_3b0.field_2._8_8_ = plVar8[3];
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    }
    else {
      local_3b0.field_2._M_allocated_capacity = *psVar10;
      local_3b0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_3b0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != paVar1) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"  }","");
    CodeWriter::operator+=(this_00,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,"  const uint8_t *begin() {","");
    CodeWriter::operator+=(this_00,&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"    return data();","");
    CodeWriter::operator+=(this_00,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"  }","");
    CodeWriter::operator+=(this_00,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0,"  const uint8_t *end() {","");
    CodeWriter::operator+=(this_00,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f0,"    return data() + size();","");
    CodeWriter::operator+=(this_00,&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"  }","");
    CodeWriter::operator+=(this_00,&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"};","");
    CodeWriter::operator+=(this_00,&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"");
    CodeWriter::operator+=(this_00,&local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (this->cur_name_space_ != (Namespace *)0x0) {
      SetNameSpace(this,(Namespace *)0x0);
    }
    std::operator+(&local_b0,"#endif  // ",&local_430);
    CodeWriter::operator+=(this_00,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_430.field_2._M_allocated_capacity;
    _Var11._M_p = local_430._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p == &local_430.field_2) goto LAB_0017bdb4;
  }
  operator_delete(_Var11._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_0017bdb4:
  psVar4 = (this->super_BaseGenerator).path_;
  psVar5 = (this->super_BaseGenerator).file_name_;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  pcVar6 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_450,pcVar6,pcVar6 + psVar5->_M_string_length);
  std::__cxx11::string::append((char *)&local_450);
  BaseGenerator::GeneratedFileName
            (&local_430,&this->super_BaseGenerator,psVar4,&local_450,&(this->opts_).super_IDLOptions
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  bVar7 = SaveFile(local_430._M_dataplus._M_p,local_450._M_dataplus._M_p,local_450._M_string_length,
                   false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool generate_bfbs_embed() {
    code_.Clear();
    code_ += "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";

    // If we don't have a root struct definition,
    if (!parser_.root_struct_def_) {
      // put a comment in the output why there is no code generated.
      code_ += "// Binary schema not generated, no root struct found";
    } else {
      auto &struct_def = *parser_.root_struct_def_;
      const auto include_guard =
          GenIncludeGuard(file_name_, *struct_def.defined_namespace, "bfbs");

      code_ += "#ifndef " + include_guard;
      code_ += "#define " + include_guard;
      code_ += "";
      if (parser_.opts.gen_nullable) {
        code_ += "#pragma clang system_header\n\n";
      }

      code_ += "#include <cstddef>";
      code_ += "#include <cstdint>";

      SetNameSpace(struct_def.defined_namespace);
      auto name = Name(struct_def);
      code_.SetValue("STRUCT_NAME", name);

      // Create code to return the binary schema data.
      auto binary_schema_hex_text =
          BufferToHexText(parser_.builder_.GetBufferPointer(),
                          parser_.builder_.GetSize(), 105, "      ", "");

      code_ += "struct {{STRUCT_NAME}}BinarySchema {";
      code_ += "  static const uint8_t *data() {";
      code_ += "    // Buffer containing the binary schema.";
      code_ += "    static const uint8_t bfbsData[" +
               NumToString(parser_.builder_.GetSize()) + "] = {";
      code_ += binary_schema_hex_text;
      code_ += "    };";
      code_ += "    return bfbsData;";
      code_ += "  }";
      code_ += "  static size_t size() {";
      code_ += "    return " + NumToString(parser_.builder_.GetSize()) + ";";
      code_ += "  }";
      code_ += "  const uint8_t *begin() {";
      code_ += "    return data();";
      code_ += "  }";
      code_ += "  const uint8_t *end() {";
      code_ += "    return data() + size();";
      code_ += "  }";
      code_ += "};";
      code_ += "";

      if (cur_name_space_) SetNameSpace(nullptr);

      // Close the include guard.
      code_ += "#endif  // " + include_guard;
    }

    // We are just adding "_bfbs" to the generated filename.
    const auto file_path =
        GeneratedFileName(path_, file_name_ + "_bfbs", opts_);
    const auto final_code = code_.ToString();

    return SaveFile(file_path.c_str(), final_code, false);
  }